

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error cff_get_var_blend(CFF_Face face,FT_UInt *num_coords,FT_Fixed **coords,
                          FT_Fixed **normalizedcoords,FT_MM_Var **mm_var)

{
  FT_Error FVar1;
  
  FVar1 = (**(code **)((long)face->mm + 0x78))();
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_get_var_blend( CFF_Face     face,
                     FT_UInt     *num_coords,
                     FT_Fixed*   *coords,
                     FT_Fixed*   *normalizedcoords,
                     FT_MM_Var*  *mm_var )
  {
    FT_Service_MultiMasters  mm = (FT_Service_MultiMasters)face->mm;


    return mm->get_var_blend( FT_FACE( face ),
                              num_coords,
                              coords,
                              normalizedcoords,
                              mm_var );
  }